

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OutputFile.cpp
# Opt level: O0

OutputFile * OutputFile::allocKeyVal(string *key_arg,string *value_arg)

{
  OutputFile *this;
  OutputFile *of;
  string *value_arg_local;
  string *key_arg_local;
  
  this = (OutputFile *)operator_new(0xd8);
  OutputFile(this);
  setKeyValue(this,key_arg,value_arg);
  return this;
}

Assistant:

OutputFile * OutputFile::allocKeyVal(const std::string & key_arg, const std::string & value_arg) {
  OutputFile * of = new OutputFile();
  of->setKeyValue(key_arg, value_arg);
  return of;
}